

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  uchar uVar1;
  uint uVar2;
  sqlite3 *db;
  char *zArg3;
  VTable *pVVar3;
  int iVar4;
  int iVar5;
  Table *pTable;
  VTable **ppVVar6;
  Vdbe *pVVar7;
  long lVar8;
  Schema **ppSVar9;
  char *pcVar10;
  uchar uVar11;
  ulong uVar12;
  
  db = pParse->db;
  if (db->mallocFailed != '\0') goto LAB_0014d476;
  if (noErr == 0) {
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    if (pTable == (Table *)0x0) goto LAB_0014d476;
  }
  else {
    db->suppressErr = db->suppressErr + '\x01';
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    db->suppressErr = db->suppressErr + 0xff;
    if (pTable == (Table *)0x0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      goto LAB_0014d476;
    }
  }
  if (pTable->pSchema == (Schema *)0x0) {
    uVar12 = 0xfff0bdc0;
  }
  else {
    uVar2 = db->nDb;
    if ((int)uVar2 < 1) {
      uVar12 = 0;
    }
    else {
      ppSVar9 = &db->aDb->pSchema;
      uVar12 = 0;
      do {
        if (*ppSVar9 == pTable->pSchema) goto LAB_0014d516;
        uVar12 = uVar12 + 1;
        ppSVar9 = ppSVar9 + 4;
      } while (uVar2 != uVar12);
      uVar12 = (ulong)uVar2;
    }
  }
LAB_0014d516:
  if (((pTable->tabFlags & 0x10) != 0) &&
     (iVar4 = sqlite3ViewGetColumnNames(pParse,pTable), iVar4 != 0)) goto LAB_0014d476;
  iVar4 = (int)uVar12;
  pcVar10 = "sqlite_master";
  if (iVar4 == 1) {
    pcVar10 = "sqlite_temp_master";
  }
  zArg3 = db->aDb[iVar4].zName;
  iVar5 = sqlite3AuthCheck(pParse,9,pcVar10,(char *)0x0,zArg3);
  if (iVar5 != 0) goto LAB_0014d476;
  if (isView == 0) {
    if ((pTable->tabFlags & 0x10) == 0) {
      iVar5 = (uint)(iVar4 == 1) * 2 + 0xb;
      goto LAB_0014d5a5;
    }
    ppVVar6 = &pTable->pVTable;
    do {
      pVVar3 = *ppVVar6;
      ppVVar6 = &pVVar3->pNext;
    } while (pVVar3->db != db);
    pcVar10 = pVVar3->pMod->zName;
    iVar5 = 0x1e;
  }
  else {
    iVar5 = (uint)(iVar4 != 1) * 2 + 0xf;
LAB_0014d5a5:
    pcVar10 = (char *)0x0;
  }
  iVar5 = sqlite3AuthCheck(pParse,iVar5,pTable->zName,pcVar10,zArg3);
  if ((iVar5 != 0) ||
     (iVar5 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,zArg3), iVar5 != 0))
  goto LAB_0014d476;
  lVar8 = 0;
  do {
    uVar12 = (ulong)(byte)pTable->zName[lVar8];
    if (uVar12 == 0) {
      uVar1 = ""[(byte)"sqlite_"[lVar8]];
      uVar11 = '\0';
LAB_0014d643:
      if (uVar11 != uVar1) goto LAB_0014d690;
      break;
    }
    uVar11 = ""[uVar12];
    uVar1 = ""[(byte)"sqlite_"[lVar8]];
    if (uVar11 != uVar1) goto LAB_0014d643;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  lVar8 = 0;
  do {
    uVar12 = (ulong)(byte)pTable->zName[lVar8];
    if (uVar12 == 0) {
      uVar1 = ""[(byte)"sqlite_stat"[lVar8]];
      uVar11 = '\0';
LAB_0014d684:
      if (uVar11 != uVar1) {
        pcVar10 = "table %s may not be dropped";
        goto LAB_0014d71b;
      }
      break;
    }
    uVar11 = ""[uVar12];
    uVar1 = ""[(byte)"sqlite_stat"[lVar8]];
    if (uVar11 != uVar1) goto LAB_0014d684;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xb);
LAB_0014d690:
  if (isView == 0) {
    if (pTable->pSelect == (Select *)0x0) goto LAB_0014d6b8;
    pcVar10 = "use DROP VIEW to delete view %s";
  }
  else {
    if (pTable->pSelect != (Select *)0x0) {
LAB_0014d6b8:
      pVVar7 = sqlite3GetVdbe(pParse);
      if (pVVar7 != (Vdbe *)0x0) {
        sqlite3BeginWriteOperation(pParse,1,iVar4);
        sqlite3ClearStatTables(pParse,iVar4,"tbl",pTable->zName);
        sqlite3FkDropTable(pParse,pName,pTable);
        sqlite3CodeDropTable(pParse,pTable,iVar4,isView);
      }
      goto LAB_0014d476;
    }
    pcVar10 = "use DROP TABLE to delete table %s";
  }
LAB_0014d71b:
  sqlite3ErrorMsg(pParse,pcVar10);
LAB_0014d476:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( noErr ) db->suppressErr++;
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ) sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
    && sqlite3StrNICmp(pTab->zName, "sqlite_stat", 11)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && pTab->pSelect==0 ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the master table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
    sqlite3FkDropTable(pParse, pName, pTab);
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}